

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktSSBOLayoutCase.cpp
# Opt level: O3

int __thiscall vkt::ssbo::SSBOLayoutCase::init(SSBOLayoutCase *this,EVP_PKEY_CTX *ctx)

{
  _Base_ptr p_Var1;
  Precision PVar2;
  DataType dataType;
  MatrixLoadFlags MVar3;
  _Rb_tree_color _Var4;
  BufferBlock *pBVar5;
  pointer pBVar6;
  pointer pBVar7;
  pointer pBVar8;
  _Alloc_hider _Var9;
  char *pcVar10;
  iterator __position;
  pointer pBVar11;
  pointer pBVar12;
  void *pvVar13;
  VarType *pVVar14;
  BufferLayout *layout;
  _Base_ptr p_Var15;
  uint uVar16;
  uint uVar17;
  DataType DVar18;
  int iVar19;
  deUint32 dVar20;
  undefined8 *puVar21;
  long *plVar22;
  long lVar23;
  undefined8 *puVar24;
  ostream *poVar25;
  size_t sVar26;
  _Rb_tree_node_base *p_Var27;
  pointer ppBVar28;
  pointer extraout_RAX;
  pointer pcVar29;
  size_type *psVar30;
  int *piVar31;
  pointer pBVar32;
  long *plVar33;
  ulong *puVar34;
  pointer ppBVar35;
  _Base_ptr p_Var36;
  pointer pBVar37;
  ShaderInterface *pSVar38;
  vector<vkt::ssbo::BlockDataPtr,_std::allocator<vkt::ssbo::BlockDataPtr>_> *pvVar39;
  DataType DVar40;
  VarType *pVVar41;
  BufferBlock *block;
  DataType elemBasicType;
  _Base_ptr p_Var42;
  _Base_ptr p_Var43;
  uint uVar44;
  pointer ppSVar45;
  int iVar46;
  int iVar47;
  ulong uVar48;
  int iVar49;
  string blockPrefix;
  BufferVarLayoutEntry entry;
  vector<const_glu::StructType_*,_std::allocator<const_glu::StructType_*>_> namedStructs;
  string prefix;
  undefined4 in_stack_fffffffffffffb44;
  MatrixLoadFlags in_stack_fffffffffffffb48;
  long local_4a8;
  undefined1 local_498 [32];
  _Base_ptr local_478;
  size_t local_470;
  BufferLayout *local_468;
  long *local_460;
  undefined8 local_458;
  long local_450;
  undefined8 uStack_448;
  ShaderInterface *local_440;
  ulong local_438;
  pointer local_430;
  vector<vkt::ssbo::BlockDataPtr,_std::allocator<vkt::ssbo::BlockDataPtr>_> *local_428;
  long *local_420;
  long local_418;
  long local_410;
  long lStack_408;
  ulong local_400;
  long *local_3f8;
  long local_3f0;
  long local_3e8;
  long lStack_3e0;
  vector<vkt::ssbo::BufferVarLayoutEntry,_std::allocator<vkt::ssbo::BufferVarLayoutEntry>_>
  *local_3d8;
  undefined1 local_3d0 [8];
  undefined1 local_3c8 [24];
  undefined8 local_3b0;
  Data DStack_3a8;
  deUint32 dStack_398;
  int iStack_394;
  bool local_390;
  ios_base local_360 [264];
  long *local_258;
  long local_250;
  long local_248;
  long lStack_240;
  undefined1 local_238 [16];
  pointer local_228;
  ulong local_218;
  ulong local_210;
  long *local_208 [2];
  long local_1f8 [2];
  long *local_1e8 [2];
  long local_1d8 [2];
  long *local_1c8 [2];
  long local_1b8 [2];
  string local_1a8 [3];
  ios_base local_138 [264];
  
  local_468 = &this->m_refLayout;
  local_400 = (ulong)((long)(this->m_interface).m_bufferBlocks.
                            super__Vector_base<vkt::ssbo::BufferBlock_*,_std::allocator<vkt::ssbo::BufferBlock_*>_>
                            ._M_impl.super__Vector_impl_data._M_finish -
                     (long)(this->m_interface).m_bufferBlocks.
                           super__Vector_base<vkt::ssbo::BufferBlock_*,_std::allocator<vkt::ssbo::BufferBlock_*>_>
                           ._M_impl.super__Vector_impl_data._M_start) >> 3;
  if (0 < (int)(uint)local_400) {
    local_3d8 = &(this->m_refLayout).bufferVars;
    local_400 = (ulong)((uint)local_400 & 0x7fffffff);
    uVar48 = 0;
    do {
      pBVar5 = (this->m_interface).m_bufferBlocks.
               super__Vector_base<vkt::ssbo::BufferBlock_*,_std::allocator<vkt::ssbo::BufferBlock_*>_>
               ._M_impl.super__Vector_impl_data._M_start[uVar48];
      local_218 = uVar48;
      if (((pBVar5->m_instanceName)._M_string_length == 0) ||
         ((pBVar5->m_instanceName)._M_dataplus._M_p == (pointer)0x0)) {
        local_498._0_8_ = local_498 + 0x10;
        local_498._8_8_ = 0;
        local_498._16_8_ = local_498._16_8_ & 0xffffffffffffff00;
      }
      else {
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)local_3d0,(pBVar5->m_blockName)._M_dataplus._M_p,
                   (allocator<char> *)local_1a8);
        puVar21 = (undefined8 *)std::__cxx11::string::append((char *)local_3d0);
        local_498._0_8_ = local_498 + 0x10;
        puVar34 = puVar21 + 2;
        if ((ulong *)*puVar21 == puVar34) {
          local_498._16_8_ = *puVar34;
          local_498._24_8_ = puVar21[3];
        }
        else {
          local_498._16_8_ = *puVar34;
          local_498._0_8_ = (ulong *)*puVar21;
        }
        local_498._8_8_ = puVar21[1];
        *puVar21 = puVar34;
        puVar21[1] = 0;
        *(undefined1 *)(puVar21 + 2) = 0;
        if (local_3d0 != (undefined1  [8])(local_3c8 + 8)) {
          operator_delete((void *)local_3d0,local_3c8._8_8_ + 1);
        }
      }
      iVar46 = (int)((ulong)((long)(this->m_refLayout).bufferVars.
                                   super__Vector_base<vkt::ssbo::BufferVarLayoutEntry,_std::allocator<vkt::ssbo::BufferVarLayoutEntry>_>
                                   ._M_impl.super__Vector_impl_data._M_finish -
                            (long)(this->m_refLayout).bufferVars.
                                  super__Vector_base<vkt::ssbo::BufferVarLayoutEntry,_std::allocator<vkt::ssbo::BufferVarLayoutEntry>_>
                                  ._M_impl.super__Vector_impl_data._M_start) >> 3) * 0x38e38e39;
      pBVar32 = (pBVar5->m_variables).
                super__Vector_base<vkt::ssbo::BufferVar,_std::allocator<vkt::ssbo::BufferVar>_>.
                _M_impl.super__Vector_impl_data._M_start;
      local_428 = (vector<vkt::ssbo::BlockDataPtr,_std::allocator<vkt::ssbo::BlockDataPtr>_> *)
                  CONCAT44(local_428._4_4_,iVar46);
      iVar49 = 0;
      if (pBVar32 !=
          *(pointer *)
           ((long)&(pBVar5->m_variables).
                   super__Vector_base<vkt::ssbo::BufferVar,_std::allocator<vkt::ssbo::BufferVar>_>.
                   _M_impl + 8)) {
        local_440 = (ShaderInterface *)
                    ((ulong)((long)(this->m_refLayout).blocks.
                                   super__Vector_base<vkt::ssbo::BlockLayoutEntry,_std::allocator<vkt::ssbo::BlockLayoutEntry>_>
                                   ._M_impl.super__Vector_impl_data._M_finish -
                            (long)(this->m_refLayout).blocks.
                                  super__Vector_base<vkt::ssbo::BlockLayoutEntry,_std::allocator<vkt::ssbo::BlockLayoutEntry>_>
                                  ._M_impl.super__Vector_impl_data._M_start) >> 6);
        iVar49 = 0;
        do {
          uVar16 = pBVar5->m_flags;
          pVVar41 = &pBVar32->m_type;
          uVar17 = pBVar32->m_flags;
          uVar44 = uVar17;
          if ((uVar17 & 3) == 0) {
            uVar44 = uVar16;
          }
          if ((uVar17 & 0xc) == 0) {
            uVar17 = uVar16;
          }
          uVar44 = uVar17 & 0xc | uVar44 & 3;
          if ((pBVar32->m_type).m_type == TYPE_ARRAY) {
            local_438 = CONCAT44(local_438._4_4_,uVar16);
            PVar2 = (pBVar32->m_type).m_data.array.size;
            if (PVar2 == ~PRECISION_LOWP) {
              PVar2 = PRECISION_LOWP;
            }
            local_3d0 = (undefined1  [8])(local_3c8 + 8);
            local_430 = pBVar32;
            std::__cxx11::string::_M_construct<char*>
                      ((string *)local_3d0,local_498._0_8_,
                       (pointer)(local_498._0_8_ + local_498._8_8_));
            std::__cxx11::string::append((char *)local_3d0);
            plVar22 = (long *)std::__cxx11::string::append((char *)local_3d0);
            local_1a8[0]._M_dataplus._M_p = (pointer)&local_1a8[0].field_2;
            psVar30 = (size_type *)(plVar22 + 2);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)*plVar22 ==
                (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)psVar30) {
              local_1a8[0].field_2._0_8_ = *psVar30;
              local_1a8[0].field_2._8_8_ = plVar22[3];
            }
            else {
              local_1a8[0].field_2._0_8_ = *psVar30;
              local_1a8[0]._M_dataplus._M_p = (pointer)*plVar22;
            }
            local_1a8[0]._M_string_length = plVar22[1];
            *plVar22 = (long)psVar30;
            plVar22[1] = 0;
            *(undefined1 *)(plVar22 + 2) = 0;
            if (local_3d0 != (undefined1  [8])(local_3c8 + 8)) {
              operator_delete((void *)local_3d0,local_3c8._8_8_ + 1);
            }
            if ((local_438 & 1) == 0) {
              iVar46 = anon_unknown_15::computeStd430BaseAlignment(pVVar41,uVar44);
            }
            else {
              iVar46 = anon_unknown_15::computeStd140BaseAlignment(pVVar41,uVar44);
            }
            DVar40 = -iVar46 & (iVar49 + iVar46) - TYPE_FLOAT;
            pVVar41 = (local_430->m_type).m_data.array.elementType;
            if (pVVar41->m_type == TYPE_BASIC) {
              dataType = (pVVar41->m_data).basic.type;
              if (dataType - TYPE_DOUBLE_MAT2 < 9 || dataType - TYPE_FLOAT_MAT2 < 9) {
                if ((uVar17 & 4) == 0) {
                  iVar46 = glu::getDataTypeMatrixNumRows(dataType);
                  iVar47 = glu::getDataTypeMatrixNumColumns(dataType);
                }
                else {
                  iVar46 = glu::getDataTypeMatrixNumColumns(dataType);
                  iVar47 = glu::getDataTypeMatrixNumRows(dataType);
                }
                DVar18 = glu::getDataTypeFloatVec(iVar46);
                uVar16 = 0;
                if (DVar18 - TYPE_FLOAT < 0x26) {
                  uVar16 = *(uint *)(&DAT_00b046c8 + (ulong)(DVar18 - TYPE_FLOAT) * 4);
                }
                local_3d0 = (undefined1  [8])(local_3c8 + 8);
                local_3c8._0_4_ = TYPE_INVALID;
                local_3c8._4_4_ = PRECISION_LOWP;
                local_3c8._8_8_ = local_3c8._8_8_ & 0xffffffffffffff00;
                DStack_3a8._12_4_ = -1;
                dStack_398 = 0xffffffff;
                iStack_394 = -1;
                local_3b0 = (_Base_ptr)0xffffffff0000005e;
                DStack_3a8.basic.type = ~TYPE_INVALID;
                DStack_3a8.basic.precision = ~PRECISION_LOWP;
                DStack_3a8.array.size = -1;
                local_390 = false;
                local_210 = (ulong)dataType;
                std::__cxx11::string::_M_assign((string *)local_3d0);
                DStack_3a8._12_4_ = uVar16 + 0xf & 0x30;
                if ((local_438 & 1) == 0) {
                  DStack_3a8._12_4_ = uVar16;
                }
                dStack_398 = 1;
                iStack_394 = 0;
                local_3b0 = (_Base_ptr)CONCAT44((int)local_440,(int)local_210);
                uVar16 = iVar47 * DStack_3a8._12_4_;
                local_390 = SUB41((uVar17 & 4) >> 2,0);
                DStack_3a8.basic.type = DVar40;
                DStack_3a8.basic.precision = PVar2;
                DStack_3a8.array.size = uVar16;
                std::
                vector<vkt::ssbo::BufferVarLayoutEntry,_std::allocator<vkt::ssbo::BufferVarLayoutEntry>_>
                ::push_back(local_3d8,(value_type *)local_3d0);
                if (local_3d0 != (undefined1  [8])(local_3c8 + 8)) {
                  operator_delete((void *)local_3d0,local_3c8._8_8_ + 1);
                }
              }
              else {
                uVar17 = 0;
                if (dataType - TYPE_FLOAT < 0x26) {
                  uVar17 = *(uint *)(&DAT_00b046c8 + (ulong)(dataType - TYPE_FLOAT) * 4);
                }
                uVar16 = uVar17 + 0xf & 0x30;
                if ((local_438 & 1) == 0) {
                  uVar16 = uVar17;
                }
                local_3d0 = (undefined1  [8])(local_3c8 + 8);
                local_3c8._0_4_ = TYPE_INVALID;
                local_3c8._4_4_ = PRECISION_LOWP;
                local_3c8._8_8_ = local_3c8._8_8_ & 0xffffffffffffff00;
                DStack_3a8._12_4_ = -1;
                dStack_398 = 0xffffffff;
                iStack_394 = -1;
                local_3b0 = (_Base_ptr)0xffffffff0000005e;
                DStack_3a8.basic.type = ~TYPE_INVALID;
                DStack_3a8.basic.precision = ~PRECISION_LOWP;
                DStack_3a8.array.size = -1;
                local_390 = false;
                std::__cxx11::string::_M_assign((string *)local_3d0);
                iStack_394 = 0;
                local_3b0 = (_Base_ptr)CONCAT44((int)local_440,dataType);
                DStack_3a8._12_4_ = 0;
                dStack_398 = 1;
                DStack_3a8.basic.type = DVar40;
                DStack_3a8.basic.precision = PVar2;
                DStack_3a8.array.size = uVar16;
                std::
                vector<vkt::ssbo::BufferVarLayoutEntry,_std::allocator<vkt::ssbo::BufferVarLayoutEntry>_>
                ::push_back(local_3d8,(value_type *)local_3d0);
                if (local_3d0 != (undefined1  [8])(local_3c8 + 8)) {
                  operator_delete((void *)local_3d0,local_3c8._8_8_ + 1);
                }
              }
            }
            else {
              pBVar6 = (this->m_refLayout).bufferVars.
                       super__Vector_base<vkt::ssbo::BufferVarLayoutEntry,_std::allocator<vkt::ssbo::BufferVarLayoutEntry>_>
                       ._M_impl.super__Vector_impl_data._M_start;
              pBVar7 = (this->m_refLayout).bufferVars.
                       super__Vector_base<vkt::ssbo::BufferVarLayoutEntry,_std::allocator<vkt::ssbo::BufferVarLayoutEntry>_>
                       ._M_impl.super__Vector_impl_data._M_finish;
              uVar16 = anon_unknown_15::computeReferenceLayout
                                 (local_468,(int)local_440,DVar40,local_1a8,pVVar41,uVar44);
              iVar47 = (int)((long)pBVar7 - (long)pBVar6 >> 3) * 0x38e38e39;
              pBVar6 = (this->m_refLayout).bufferVars.
                       super__Vector_base<vkt::ssbo::BufferVarLayoutEntry,_std::allocator<vkt::ssbo::BufferVarLayoutEntry>_>
                       ._M_impl.super__Vector_impl_data._M_start;
              iVar46 = (int)((long)(this->m_refLayout).bufferVars.
                                   super__Vector_base<vkt::ssbo::BufferVarLayoutEntry,_std::allocator<vkt::ssbo::BufferVarLayoutEntry>_>
                                   ._M_impl.super__Vector_impl_data._M_finish - (long)pBVar6 >> 3) *
                       0x38e38e39;
              if (iVar47 < iVar46) {
                lVar23 = (long)iVar46 - (long)iVar47;
                piVar31 = &pBVar6[iVar47].topLevelArrayStride;
                do {
                  piVar31[-1] = PVar2;
                  *piVar31 = uVar16;
                  piVar31 = piVar31 + 0x12;
                  lVar23 = lVar23 + -1;
                } while (lVar23 != 0);
              }
            }
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_1a8[0]._M_dataplus._M_p != &local_1a8[0].field_2) {
              operator_delete(local_1a8[0]._M_dataplus._M_p,
                              local_1a8[0].field_2._M_allocated_capacity + 1);
            }
            iVar46 = (DVar40 - iVar49) + uVar16 * PVar2;
            pBVar32 = local_430;
          }
          else {
            local_3d0 = (undefined1  [8])(local_3c8 + 8);
            std::__cxx11::string::_M_construct<char*>
                      ((string *)local_3d0,local_498._0_8_,
                       (pointer)(local_498._0_8_ + local_498._8_8_));
            std::__cxx11::string::append((char *)local_3d0);
            iVar46 = anon_unknown_15::computeReferenceLayout
                               (local_468,(int)local_440,iVar49,(string *)local_3d0,pVVar41,uVar44);
            if (local_3d0 != (undefined1  [8])(local_3c8 + 8)) {
              operator_delete((void *)local_3d0,local_3c8._8_8_ + 1);
            }
          }
          iVar49 = iVar49 + iVar46;
          pBVar32 = pBVar32 + 1;
        } while (pBVar32 !=
                 *(pointer *)
                  ((long)&(pBVar5->m_variables).
                          super__Vector_base<vkt::ssbo::BufferVar,_std::allocator<vkt::ssbo::BufferVar>_>
                          ._M_impl + 8));
        iVar46 = (int)((ulong)((long)(this->m_refLayout).bufferVars.
                                     super__Vector_base<vkt::ssbo::BufferVarLayoutEntry,_std::allocator<vkt::ssbo::BufferVarLayoutEntry>_>
                                     ._M_impl.super__Vector_impl_data._M_finish -
                              (long)(this->m_refLayout).bufferVars.
                                    super__Vector_base<vkt::ssbo::BufferVarLayoutEntry,_std::allocator<vkt::ssbo::BufferVarLayoutEntry>_>
                                    ._M_impl.super__Vector_impl_data._M_start) >> 3) * 0x38e38e39;
      }
      iVar47 = pBVar5->m_arraySize;
      if (pBVar5->m_arraySize < 2) {
        iVar47 = 1;
      }
      local_430 = (pointer)CONCAT44(local_430._4_4_,iVar47);
      iVar47 = 0;
      do {
        local_3d0 = (undefined1  [8])(local_3c8 + 8);
        local_3c8._0_4_ = TYPE_INVALID;
        local_3c8._4_4_ = PRECISION_LOWP;
        local_3c8._8_8_ = local_3c8._8_8_ & 0xffffffffffffff00;
        local_3b0 = (_Base_ptr)((ulong)local_3b0 & 0xffffffff00000000);
        dStack_398 = 0;
        iStack_394 = 0;
        DStack_3a8.basic.type = TYPE_INVALID;
        DStack_3a8.basic.precision = PRECISION_LOWP;
        DStack_3a8.array.size = 0;
        DStack_3a8._12_4_ = 0;
        std::vector<vkt::ssbo::BlockLayoutEntry,_std::allocator<vkt::ssbo::BlockLayoutEntry>_>::
        emplace_back<vkt::ssbo::BlockLayoutEntry>(&local_468->blocks,(BlockLayoutEntry *)local_3d0);
        pvVar13 = (void *)CONCAT44(DStack_3a8.basic.precision,DStack_3a8.basic.type);
        if (pvVar13 != (void *)0x0) {
          operator_delete(pvVar13,CONCAT44(iStack_394,dStack_398) - (long)pvVar13);
        }
        if (local_3d0 != (undefined1  [8])(local_3c8 + 8)) {
          operator_delete((void *)local_3d0,local_3c8._8_8_ + 1);
        }
        pBVar8 = (this->m_refLayout).blocks.
                 super__Vector_base<vkt::ssbo::BlockLayoutEntry,_std::allocator<vkt::ssbo::BlockLayoutEntry>_>
                 ._M_impl.super__Vector_impl_data._M_finish;
        _Var9._M_p = (pBVar5->m_blockName)._M_dataplus._M_p;
        pcVar10 = (char *)pBVar8[-1].name._M_string_length;
        strlen(_Var9._M_p);
        std::__cxx11::string::_M_replace((ulong)(pBVar8 + -1),0,pcVar10,(ulong)_Var9._M_p);
        pBVar8[-1].size = iVar49;
        local_3d0._0_4_ = (int)local_428;
        if ((int)local_428 < iVar46) {
          iVar19 = (int)local_428;
          do {
            __position._M_current =
                 pBVar8[-1].activeVarIndices.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                 super__Vector_impl_data._M_finish;
            if (__position._M_current ==
                pBVar8[-1].activeVarIndices.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                super__Vector_impl_data._M_end_of_storage) {
              std::vector<int,std::allocator<int>>::_M_realloc_insert<int_const&>
                        ((vector<int,std::allocator<int>> *)&pBVar8[-1].activeVarIndices,__position,
                         (int *)local_3d0);
            }
            else {
              *__position._M_current = iVar19;
              pBVar8[-1].activeVarIndices.super__Vector_base<int,_std::allocator<int>_>._M_impl.
              super__Vector_impl_data._M_finish = __position._M_current + 1;
            }
            iVar19 = local_3d0._0_4_ + TYPE_ARRAY;
            local_3d0._0_4_ = iVar19;
          } while (iVar19 < iVar46);
        }
        if (0 < pBVar5->m_arraySize) {
          std::__cxx11::ostringstream::ostringstream((ostringstream *)local_3d0);
          std::ostream::operator<<((ostringstream *)local_3d0,iVar47);
          std::__cxx11::stringbuf::str();
          std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_3d0);
          std::ios_base::~ios_base(local_360);
          puVar21 = (undefined8 *)
                    std::__cxx11::string::replace((ulong)&local_420,0,(char *)0x0,0xb2a0c0);
          local_460 = &local_450;
          plVar22 = puVar21 + 2;
          if ((long *)*puVar21 == plVar22) {
            local_450 = *plVar22;
            uStack_448 = puVar21[3];
          }
          else {
            local_450 = *plVar22;
            local_460 = (long *)*puVar21;
          }
          local_458 = puVar21[1];
          *puVar21 = plVar22;
          puVar21[1] = 0;
          *(undefined1 *)(puVar21 + 2) = 0;
          plVar22 = (long *)std::__cxx11::string::append((char *)&local_460);
          local_1a8[0]._M_dataplus._M_p = (pointer)&local_1a8[0].field_2;
          psVar30 = (size_type *)(plVar22 + 2);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)*plVar22 ==
              (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)psVar30) {
            local_1a8[0].field_2._0_8_ = *psVar30;
            local_1a8[0].field_2._8_8_ = plVar22[3];
          }
          else {
            local_1a8[0].field_2._0_8_ = *psVar30;
            local_1a8[0]._M_dataplus._M_p = (pointer)*plVar22;
          }
          local_1a8[0]._M_string_length = plVar22[1];
          *plVar22 = (long)psVar30;
          plVar22[1] = 0;
          *(undefined1 *)(plVar22 + 2) = 0;
          std::__cxx11::string::_M_append
                    ((char *)(pBVar8 + -1),(ulong)local_1a8[0]._M_dataplus._M_p);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_1a8[0]._M_dataplus._M_p != &local_1a8[0].field_2) {
            operator_delete(local_1a8[0]._M_dataplus._M_p,
                            local_1a8[0].field_2._M_allocated_capacity + 1);
          }
          if (local_460 != &local_450) {
            operator_delete(local_460,local_450 + 1);
          }
          if (local_420 != &local_410) {
            operator_delete(local_420,local_410 + 1);
          }
        }
        iVar47 = iVar47 + 1;
      } while (iVar47 != (int)local_430);
      if ((undefined1 *)local_498._0_8_ != local_498 + 0x10) {
        operator_delete((void *)local_498._0_8_,local_498._16_8_ + 1);
      }
      uVar48 = local_218 + 1;
    } while (uVar48 != local_400);
  }
  layout = local_468;
  pSVar38 = &this->m_interface;
  anon_unknown_15::initRefDataStorage(pSVar38,local_468,&this->m_initialData);
  local_440 = pSVar38;
  anon_unknown_15::initRefDataStorage(pSVar38,layout,&this->m_writeData);
  pvVar39 = &(this->m_initialData).pointers;
  dVar20 = deStringHash((this->super_TestCase).super_TestCase.super_TestNode.m_name._M_dataplus._M_p
                       );
  local_428 = pvVar39;
  anon_unknown_15::generateValues(layout,pvVar39,dVar20 ^ 0xad2f7214);
  pvVar39 = &(this->m_writeData).pointers;
  dVar20 = deStringHash((this->super_TestCase).super_TestCase.super_TestNode.m_name._M_dataplus._M_p
                       );
  local_430 = (pointer)pvVar39;
  anon_unknown_15::generateValues(layout,pvVar39,dVar20 ^ 0x25ca4e7);
  ppBVar28 = (this->m_interface).m_bufferBlocks.
             super__Vector_base<vkt::ssbo::BufferBlock_*,_std::allocator<vkt::ssbo::BufferBlock_*>_>
             ._M_impl.super__Vector_impl_data._M_start;
  if (0 < (int)((ulong)((long)(this->m_interface).m_bufferBlocks.
                              super__Vector_base<vkt::ssbo::BufferBlock_*,_std::allocator<vkt::ssbo::BufferBlock_*>_>
                              ._M_impl.super__Vector_impl_data._M_finish - (long)ppBVar28) >> 3)) {
    uVar48 = 0;
    do {
      pBVar5 = ppBVar28[uVar48];
      iVar49 = pBVar5->m_arraySize;
      iVar46 = 1;
      if (1 < iVar49) {
        iVar46 = iVar49;
      }
      if (iVar49 < 1) {
        iVar46 = 1;
      }
      iVar47 = 0;
      local_438 = uVar48;
      do {
        puVar34 = (ulong *)(local_498 + 0x10);
        pcVar10 = (pBVar5->m_blockName)._M_dataplus._M_p;
        if (iVar49 < 1) {
          puVar21 = (undefined8 *)(local_498 + 8);
          local_498._0_8_ = puVar34;
        }
        else {
          std::__cxx11::ostringstream::ostringstream((ostringstream *)local_3d0);
          std::ostream::operator<<((SubTypeAccess *)local_3d0,iVar47);
          std::__cxx11::stringbuf::str();
          std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_3d0);
          std::ios_base::~ios_base(local_360);
          plVar22 = (long *)std::__cxx11::string::replace((ulong)local_208,0,(char *)0x0,0xb2a0c0);
          plVar33 = plVar22 + 2;
          if ((long *)*plVar22 == plVar33) {
            local_248 = *plVar33;
            lStack_240 = plVar22[3];
            local_258 = &local_248;
          }
          else {
            local_248 = *plVar33;
            local_258 = (long *)*plVar22;
          }
          local_250 = plVar22[1];
          *plVar22 = (long)plVar33;
          plVar22[1] = 0;
          *(undefined1 *)(plVar22 + 2) = 0;
          puVar24 = (undefined8 *)std::__cxx11::string::append((char *)&local_258);
          local_498._0_8_ = local_498 + 0x10;
          puVar34 = puVar24 + 2;
          if ((ulong *)*puVar24 == puVar34) {
            local_498._16_8_ = *puVar34;
            local_498._24_8_ = puVar24[3];
          }
          else {
            local_498._16_8_ = *puVar34;
            local_498._0_8_ = (ulong *)*puVar24;
          }
          puVar21 = puVar24 + 1;
          local_498._8_8_ = puVar24[1];
          *puVar24 = puVar34;
        }
        *puVar21 = 0;
        *(undefined1 *)puVar34 = 0;
        strlen(pcVar10);
        plVar22 = (long *)std::__cxx11::string::replace
                                    ((ulong)local_498,0,(char *)0x0,(ulong)pcVar10);
        local_1a8[0]._M_dataplus._M_p = (pointer)&local_1a8[0].field_2;
        psVar30 = (size_type *)(plVar22 + 2);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)*plVar22 ==
            (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)psVar30) {
          local_1a8[0].field_2._0_8_ = *psVar30;
          local_1a8[0].field_2._8_8_ = plVar22[3];
        }
        else {
          local_1a8[0].field_2._0_8_ = *psVar30;
          local_1a8[0]._M_dataplus._M_p = (pointer)*plVar22;
        }
        local_1a8[0]._M_string_length = plVar22[1];
        *plVar22 = (long)psVar30;
        plVar22[1] = 0;
        *(undefined1 *)(plVar22 + 2) = 0;
        if ((undefined1 *)local_498._0_8_ != local_498 + 0x10) {
          operator_delete((void *)local_498._0_8_,local_498._16_8_ + 1);
        }
        if (0 < iVar49) {
          if (local_258 != &local_248) {
            operator_delete(local_258,local_248 + 1);
          }
          if (local_208[0] != local_1f8) {
            operator_delete(local_208[0],local_1f8[0] + 1);
          }
        }
        iVar19 = BufferLayout::getBlockIndex(local_468,local_1a8);
        pBVar32 = (pBVar5->m_variables).
                  super__Vector_base<vkt::ssbo::BufferVar,_std::allocator<vkt::ssbo::BufferVar>_>.
                  _M_impl.super__Vector_impl_data._M_start;
        pBVar37 = (pBVar5->m_variables).
                  super__Vector_base<vkt::ssbo::BufferVar,_std::allocator<vkt::ssbo::BufferVar>_>.
                  _M_impl.super__Vector_impl_data._M_finish;
        if (pBVar32 != pBVar37) {
          pBVar11 = (local_428->
                    super__Vector_base<vkt::ssbo::BlockDataPtr,_std::allocator<vkt::ssbo::BlockDataPtr>_>
                    )._M_impl.super__Vector_impl_data._M_start;
          pBVar12 = (((_Vector_base<vkt::ssbo::BlockDataPtr,_std::allocator<vkt::ssbo::BlockDataPtr>_>
                       *)&local_430->m_name)->_M_impl).super__Vector_impl_data._M_start;
          pVVar41 = &pBVar32->m_type;
          do {
            if ((pVVar41[1].m_type & 0x400) == TYPE_BASIC) {
              glu::SubTypeAccess::SubTypeAccess((SubTypeAccess *)local_3d0,pVVar41);
              anon_unknown_15::copyNonWrittenData
                        (local_468,pBVar5,iVar47,pBVar11 + iVar19,pBVar12 + iVar19,
                         (BufferVar *)((long)&pVVar41[-2].m_data + 8),(SubTypeAccess *)local_3d0);
              if ((Data *)local_3c8._16_8_ != (Data *)0x0) {
                operator_delete((void *)local_3c8._16_8_,
                                CONCAT44(DStack_3a8.basic.precision,DStack_3a8.basic.type) -
                                local_3c8._16_8_);
              }
              glu::VarType::~VarType((VarType *)local_3d0);
              pBVar37 = (pBVar5->m_variables).
                        super__Vector_base<vkt::ssbo::BufferVar,_std::allocator<vkt::ssbo::BufferVar>_>
                        ._M_impl.super__Vector_impl_data._M_finish;
            }
            pVVar14 = pVVar41 + 1;
            pVVar41 = (VarType *)((long)&pVVar41[2].m_data + 8);
          } while ((pointer)&pVVar14->m_data != pBVar37);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_1a8[0]._M_dataplus._M_p != &local_1a8[0].field_2) {
          operator_delete(local_1a8[0]._M_dataplus._M_p,
                          local_1a8[0].field_2._M_allocated_capacity + 1);
        }
        iVar47 = iVar47 + 1;
      } while (iVar47 != iVar46);
      uVar48 = local_438 + 1;
      ppBVar28 = (this->m_interface).m_bufferBlocks.
                 super__Vector_base<vkt::ssbo::BufferBlock_*,_std::allocator<vkt::ssbo::BufferBlock_*>_>
                 ._M_impl.super__Vector_impl_data._M_start;
    } while ((long)uVar48 <
             (long)(int)((ulong)((long)(this->m_interface).m_bufferBlocks.
                                       super__Vector_base<vkt::ssbo::BufferBlock_*,_std::allocator<vkt::ssbo::BufferBlock_*>_>
                                       ._M_impl.super__Vector_impl_data._M_finish - (long)ppBVar28)
                        >> 3));
  }
  MVar3 = this->m_matrixLoadFlag;
  std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1a8);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"#version 310 es\n",0x10);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)local_1a8,"layout(local_size_x = 1) in;\n",0x1d);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"\n",1);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)local_1a8,
             "layout(std140, binding = 0) buffer AcBlock { highp uint ac_numPassed; };\n\n",0x4a);
  local_238 = (undefined1  [16])0x0;
  local_228 = (pointer)0x0;
  ShaderInterface::getNamedStructs
            (local_440,
             (vector<const_glu::StructType_*,_std::allocator<const_glu::StructType_*>_> *)local_238)
  ;
  if (local_238._0_8_ != local_238._8_8_) {
    ppSVar45 = (pointer)local_238._0_8_;
    do {
      local_3d0 = (undefined1  [8])*ppSVar45;
      local_3c8._0_8_ = local_3c8._0_8_ & 0xffffffff00000000;
      poVar25 = glu::decl::operator<<((ostream *)local_1a8,(DeclareStructTypePtr *)local_3d0);
      std::__ostream_insert<char,std::char_traits<char>>(poVar25,";\n",2);
      ppSVar45 = ppSVar45 + 1;
    } while (ppSVar45 != (pointer)local_238._8_8_);
  }
  local_4a8 = 0;
  while (ppBVar28 = (this->m_interface).m_bufferBlocks.
                    super__Vector_base<vkt::ssbo::BufferBlock_*,_std::allocator<vkt::ssbo::BufferBlock_*>_>
                    ._M_impl.super__Vector_impl_data._M_start,
        local_4a8 <
        (int)((ulong)((long)(this->m_interface).m_bufferBlocks.
                            super__Vector_base<vkt::ssbo::BufferBlock_*,_std::allocator<vkt::ssbo::BufferBlock_*>_>
                            ._M_impl.super__Vector_impl_data._M_finish - (long)ppBVar28) >> 3)) {
    pBVar5 = ppBVar28[local_4a8];
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"layout(",7);
    if ((pBVar5->m_flags & 0xf) != 0) {
      local_3d0 = (undefined1  [8])(CONCAT44(local_3d0._4_4_,pBVar5->m_flags) & 0xffffffff0000000f);
      ssbo::operator<<((ostream *)local_1a8,(LayoutFlagsFmt *)local_3d0);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,", ",2);
    }
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"binding = ",10);
    local_4a8 = local_4a8 + 1;
    std::ostream::operator<<(local_1a8,(int)local_4a8);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,") ",2);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"buffer ",7);
    _Var9._M_p = (pBVar5->m_blockName)._M_dataplus._M_p;
    if (_Var9._M_p == (char *)0x0) {
      std::ios::clear((int)&stack0xfffffffffffffb38 +
                      (int)*(undefined8 *)(local_1a8[0]._M_dataplus._M_p + -0x18) + 800);
    }
    else {
      sVar26 = strlen(_Var9._M_p);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,_Var9._M_p,sVar26);
    }
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"\n{\n",3);
    for (pBVar32 = (pBVar5->m_variables).
                   super__Vector_base<vkt::ssbo::BufferVar,_std::allocator<vkt::ssbo::BufferVar>_>.
                   _M_impl.super__Vector_impl_data._M_start;
        pBVar32 !=
        *(pointer *)
         ((long)&(pBVar5->m_variables).
                 super__Vector_base<vkt::ssbo::BufferVar,_std::allocator<vkt::ssbo::BufferVar>_>.
                 _M_impl + 8); pBVar32 = pBVar32 + 1) {
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"\t",1);
      if ((pBVar32->m_flags & 0xf) != 0) {
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"layout(",7);
        local_3d0 = (undefined1  [8])
                    (CONCAT44(local_3d0._4_4_,pBVar32->m_flags) & 0xffffffff0000000f);
        ssbo::operator<<((ostream *)local_1a8,(LayoutFlagsFmt *)local_3d0);
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,") ",2);
      }
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)local_498,(pBVar32->m_name)._M_dataplus._M_p,
                 (allocator<char> *)&local_460);
      glu::decl::DeclareVariable::DeclareVariable
                ((DeclareVariable *)local_3d0,&pBVar32->m_type,(string *)local_498,1);
      glu::decl::operator<<((ostream *)local_1a8,(DeclareVariable *)local_3d0);
      if ((Data *)local_3c8._16_8_ != &DStack_3a8) {
        operator_delete((void *)local_3c8._16_8_,
                        CONCAT44(DStack_3a8.basic.precision,DStack_3a8.basic.type) + 1);
      }
      glu::VarType::~VarType((VarType *)local_3d0);
      if ((undefined1 *)local_498._0_8_ != local_498 + 0x10) {
        operator_delete((void *)local_498._0_8_,local_498._16_8_ + 1);
      }
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,";\n",2);
    }
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"}",1);
    if (((pBVar5->m_instanceName)._M_string_length != 0) &&
       ((pBVar5->m_instanceName)._M_dataplus._M_p != (pointer)0x0)) {
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8," ",1);
      pcVar10 = (pBVar5->m_instanceName)._M_dataplus._M_p;
      if (pcVar10 == (char *)0x0 || (pBVar5->m_instanceName)._M_string_length == 0) {
        std::ios::clear((int)&stack0xfffffffffffffb38 +
                        (int)*(undefined8 *)(local_1a8[0]._M_dataplus._M_p + -0x18) + 800);
      }
      else {
        sVar26 = strlen(pcVar10);
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,pcVar10,sVar26);
      }
      if (0 < pBVar5->m_arraySize) {
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"[",1);
        poVar25 = (ostream *)std::ostream::operator<<(local_1a8,pBVar5->m_arraySize);
        std::__ostream_insert<char,std::char_traits<char>>(poVar25,"]",1);
      }
    }
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,";\n",2);
  }
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"\n",1);
  iVar49 = 0;
  local_3c8._0_8_ = local_3c8._0_8_ & 0xffffffff00000000;
  local_3c8._8_8_ = 0;
  local_3c8._16_8_ = (_Rb_tree_node_base *)local_3c8;
  local_3b0 = (_Rb_tree_node_base *)local_3c8;
  DStack_3a8.basic.type = TYPE_INVALID;
  DStack_3a8.basic.precision = PRECISION_LOWP;
  p_Var1 = (_Base_ptr)(local_498 + 8);
  local_498._8_8_ = local_498._8_8_ & 0xffffffff00000000;
  local_498._16_8_ = (undefined1 *)0x0;
  local_470 = 0;
  ppBVar28 = (this->m_interface).m_bufferBlocks.
             super__Vector_base<vkt::ssbo::BufferBlock_*,_std::allocator<vkt::ssbo::BufferBlock_*>_>
             ._M_impl.super__Vector_impl_data._M_start;
  ppBVar35 = (this->m_interface).m_bufferBlocks.
             super__Vector_base<vkt::ssbo::BufferBlock_*,_std::allocator<vkt::ssbo::BufferBlock_*>_>
             ._M_impl.super__Vector_impl_data._M_finish;
  local_498._24_8_ = p_Var1;
  local_478 = p_Var1;
  if (0 < (int)((ulong)((long)ppBVar35 - (long)ppBVar28) >> 3)) {
    lVar23 = 0;
    do {
      pBVar5 = ppBVar28[lVar23];
      pBVar32 = (pBVar5->m_variables).
                super__Vector_base<vkt::ssbo::BufferVar,_std::allocator<vkt::ssbo::BufferVar>_>.
                _M_impl.super__Vector_impl_data._M_start;
      if (pBVar32 !=
          *(pointer *)
           ((long)&(pBVar5->m_variables).
                   super__Vector_base<vkt::ssbo::BufferVar,_std::allocator<vkt::ssbo::BufferVar>_>.
                   _M_impl + 8)) {
        do {
          anon_unknown_15::collectUniqueBasicTypes
                    ((set<glu::DataType,_std::less<glu::DataType>,_std::allocator<glu::DataType>_> *
                     )local_3d0,&pBVar32->m_type);
          pBVar32 = pBVar32 + 1;
        } while (pBVar32 !=
                 *(pointer *)
                  ((long)&(pBVar5->m_variables).
                          super__Vector_base<vkt::ssbo::BufferVar,_std::allocator<vkt::ssbo::BufferVar>_>
                          ._M_impl + 8));
        ppBVar28 = (this->m_interface).m_bufferBlocks.
                   super__Vector_base<vkt::ssbo::BufferBlock_*,_std::allocator<vkt::ssbo::BufferBlock_*>_>
                   ._M_impl.super__Vector_impl_data._M_start;
        ppBVar35 = (this->m_interface).m_bufferBlocks.
                   super__Vector_base<vkt::ssbo::BufferBlock_*,_std::allocator<vkt::ssbo::BufferBlock_*>_>
                   ._M_impl.super__Vector_impl_data._M_finish;
      }
      lVar23 = lVar23 + 1;
    } while (lVar23 < (int)((ulong)((long)ppBVar35 - (long)ppBVar28) >> 3));
    if ((_Rb_tree_node_base *)local_3c8._16_8_ != (_Rb_tree_node_base *)local_3c8) {
      p_Var27 = (_Rb_tree_node_base *)local_3c8._16_8_;
      do {
        _Var4 = p_Var27[1]._M_color;
        local_460 = (long *)CONCAT44(local_460._4_4_,_Var4);
        if (_Var4 - 5 < 9) {
          local_420._0_4_ = 1;
          std::
          _Rb_tree<glu::DataType,_glu::DataType,_std::_Identity<glu::DataType>,_std::less<glu::DataType>,_std::allocator<glu::DataType>_>
          ::_M_insert_unique<glu::DataType>
                    ((_Rb_tree<glu::DataType,_glu::DataType,_std::_Identity<glu::DataType>,_std::less<glu::DataType>,_std::allocator<glu::DataType>_>
                      *)local_498,(DataType *)&local_420);
          iVar46 = glu::getDataTypeMatrixNumRows((DataType)local_460);
          DVar40 = glu::getDataTypeFloatVec(iVar46);
          local_420 = (long *)CONCAT44(local_420._4_4_,DVar40);
          std::
          _Rb_tree<glu::DataType,_glu::DataType,_std::_Identity<glu::DataType>,_std::less<glu::DataType>,_std::allocator<glu::DataType>_>
          ::_M_insert_unique<glu::DataType>
                    ((_Rb_tree<glu::DataType,_glu::DataType,_std::_Identity<glu::DataType>,_std::less<glu::DataType>,_std::allocator<glu::DataType>_>
                      *)local_498,(DataType *)&local_420);
        }
        else if (_Var4 + ~_S_black < 3) {
          local_420 = (long *)CONCAT44(local_420._4_4_,1);
          std::
          _Rb_tree<glu::DataType,_glu::DataType,_std::_Identity<glu::DataType>,_std::less<glu::DataType>,_std::allocator<glu::DataType>_>
          ::_M_insert_unique<glu::DataType>
                    ((_Rb_tree<glu::DataType,_glu::DataType,_std::_Identity<glu::DataType>,_std::less<glu::DataType>,_std::allocator<glu::DataType>_>
                      *)local_498,(DataType *)&local_420);
        }
        std::
        _Rb_tree<glu::DataType,glu::DataType,std::_Identity<glu::DataType>,std::less<glu::DataType>,std::allocator<glu::DataType>>
        ::_M_insert_unique<glu::DataType_const&>
                  ((_Rb_tree<glu::DataType,glu::DataType,std::_Identity<glu::DataType>,std::less<glu::DataType>,std::allocator<glu::DataType>>
                    *)local_498,(DataType *)&local_460);
        p_Var27 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var27);
      } while (p_Var27 != (_Rb_tree_node_base *)local_3c8);
    }
  }
  do {
    p_Var15 = (_Base_ptr)local_498._16_8_;
    p_Var43 = p_Var1;
    if ((undefined1 *)local_498._16_8_ != (undefined1 *)0x0) {
      do {
        p_Var42 = p_Var43;
        p_Var36 = p_Var15;
        _Var4 = p_Var36[1]._M_color;
        p_Var43 = p_Var36;
        if ((int)_Var4 < iVar49) {
          p_Var43 = p_Var42;
        }
        p_Var15 = (&p_Var36->_M_left)[(int)_Var4 < iVar49];
      } while ((&p_Var36->_M_left)[(int)_Var4 < iVar49] != (_Base_ptr)0x0);
      if (p_Var43 != p_Var1) {
        if ((int)_Var4 < iVar49) {
          p_Var36 = p_Var42;
        }
        if ((int)p_Var36[1]._M_color <= iVar49) {
          uVar16 = iVar49 - 1;
          if ((uVar16 < 0x26) && ((0x3ffc001fffU >> ((ulong)uVar16 & 0x3f) & 1) != 0)) {
            pcVar10 = (&PTR_anon_var_dwarf_fde27c_00cfb710)[uVar16];
            sVar26 = strlen(pcVar10);
            std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,pcVar10,sVar26);
          }
          else {
            std::ios::clear((int)&stack0xfffffffffffffb38 +
                            (int)*(undefined8 *)(local_1a8[0]._M_dataplus._M_p + -0x18) + 800);
          }
        }
      }
    }
    iVar49 = iVar49 + 1;
  } while (iVar49 != 0x5e);
  std::
  _Rb_tree<glu::DataType,_glu::DataType,_std::_Identity<glu::DataType>,_std::less<glu::DataType>,_std::allocator<glu::DataType>_>
  ::~_Rb_tree((_Rb_tree<glu::DataType,_glu::DataType,_std::_Identity<glu::DataType>,_std::less<glu::DataType>,_std::allocator<glu::DataType>_>
               *)local_498);
  std::
  _Rb_tree<glu::DataType,_glu::DataType,_std::_Identity<glu::DataType>,_std::less<glu::DataType>,_std::allocator<glu::DataType>_>
  ::~_Rb_tree((_Rb_tree<glu::DataType,_glu::DataType,_std::_Identity<glu::DataType>,_std::less<glu::DataType>,_std::allocator<glu::DataType>_>
               *)local_3d0);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)local_1a8,"\nvoid main (void)\n{\n\tbool allOk = true;\n",0x28);
  ppBVar28 = (this->m_interface).m_bufferBlocks.
             super__Vector_base<vkt::ssbo::BufferBlock_*,_std::allocator<vkt::ssbo::BufferBlock_*>_>
             ._M_impl.super__Vector_impl_data._M_start;
  if (0 < (int)((ulong)((long)(this->m_interface).m_bufferBlocks.
                              super__Vector_base<vkt::ssbo::BufferBlock_*,_std::allocator<vkt::ssbo::BufferBlock_*>_>
                              ._M_impl.super__Vector_impl_data._M_finish - (long)ppBVar28) >> 3)) {
    pSVar38 = (ShaderInterface *)0x0;
    do {
      pBVar5 = ppBVar28[(long)pSVar38];
      iVar49 = pBVar5->m_arraySize;
      iVar46 = 1;
      if (1 < iVar49) {
        iVar46 = iVar49;
      }
      if (iVar49 < 1) {
        iVar46 = 1;
      }
      local_438 = CONCAT44(local_438._4_4_,iVar46);
      block = (BufferBlock *)0x0;
      local_440 = pSVar38;
      do {
        pBVar8 = (((_Vector_base<vkt::ssbo::BlockLayoutEntry,_std::allocator<vkt::ssbo::BlockLayoutEntry>_>
                    *)&(pBVar5->m_blockName)._M_dataplus)->_M_impl).super__Vector_impl_data._M_start
        ;
        if (iVar49 < 1) {
          puVar21 = &local_458;
          plVar22 = &local_450;
          local_460 = &local_450;
        }
        else {
          std::__cxx11::ostringstream::ostringstream((ostringstream *)local_3d0);
          std::ostream::operator<<((BufferVar *)local_3d0,(int)block);
          std::__cxx11::stringbuf::str();
          std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_3d0);
          std::ios_base::~ios_base(local_360);
          plVar22 = (long *)std::__cxx11::string::replace((ulong)local_1e8,0,(char *)0x0,0xb2a0c0);
          local_3f8 = &local_3e8;
          plVar33 = plVar22 + 2;
          if ((long *)*plVar22 == plVar33) {
            local_3e8 = *plVar33;
            lStack_3e0 = plVar22[3];
          }
          else {
            local_3e8 = *plVar33;
            local_3f8 = (long *)*plVar22;
          }
          local_3f0 = plVar22[1];
          *plVar22 = (long)plVar33;
          plVar22[1] = 0;
          *(undefined1 *)(plVar22 + 2) = 0;
          puVar24 = (undefined8 *)std::__cxx11::string::append((char *)&local_3f8);
          plVar22 = puVar24 + 2;
          if ((long *)*puVar24 == plVar22) {
            local_450 = *plVar22;
            uStack_448 = puVar24[3];
            local_460 = &local_450;
          }
          else {
            local_450 = *plVar22;
            local_460 = (long *)*puVar24;
          }
          puVar21 = puVar24 + 1;
          local_458 = puVar24[1];
          *puVar24 = plVar22;
        }
        *puVar21 = 0;
        *(undefined1 *)plVar22 = 0;
        strlen((char *)pBVar8);
        puVar21 = (undefined8 *)
                  std::__cxx11::string::replace((ulong)&local_460,0,(char *)0x0,(ulong)pBVar8);
        local_498._0_8_ = local_498 + 0x10;
        puVar34 = puVar21 + 2;
        if ((ulong *)*puVar21 == puVar34) {
          local_498._16_8_ = *puVar34;
          local_498._24_8_ = puVar21[3];
        }
        else {
          local_498._16_8_ = *puVar34;
          local_498._0_8_ = (ulong *)*puVar21;
        }
        local_498._8_8_ = puVar21[1];
        *puVar21 = puVar34;
        puVar21[1] = 0;
        *(undefined1 *)(puVar21 + 2) = 0;
        if (local_460 != &local_450) {
          operator_delete(local_460,local_450 + 1);
        }
        if (0 < iVar49) {
          if (local_3f8 != &local_3e8) {
            operator_delete(local_3f8,local_3e8 + 1);
          }
          if (local_1e8[0] != local_1d8) {
            operator_delete(local_1e8[0],local_1d8[0] + 1);
          }
        }
        iVar46 = BufferLayout::getBlockIndex(local_468,(string *)local_498);
        pBVar32 = *(pointer *)
                   &(pBVar5->m_variables).
                    super__Vector_base<vkt::ssbo::BufferVar,_std::allocator<vkt::ssbo::BufferVar>_>.
                    _M_impl;
        pBVar37 = *(pointer *)
                   ((long)&(pBVar5->m_variables).
                           super__Vector_base<vkt::ssbo::BufferVar,_std::allocator<vkt::ssbo::BufferVar>_>
                   + 8);
        if (pBVar32 != pBVar37) {
          pBVar11 = (local_428->
                    super__Vector_base<vkt::ssbo::BlockDataPtr,_std::allocator<vkt::ssbo::BlockDataPtr>_>
                    )._M_impl.super__Vector_impl_data._M_start;
          pVVar41 = &pBVar32->m_type;
          do {
            if ((pVVar41[1].m_type & 0x200) != TYPE_BASIC) {
              glu::SubTypeAccess::SubTypeAccess((SubTypeAccess *)local_3d0,pVVar41);
              anon_unknown_15::generateCompareSrc
                        ((ostream *)local_1a8,(char *)local_468,(BufferLayout *)pBVar5,block,
                         iVar46 * 0x10 + (int)pBVar11,
                         (BlockDataPtr *)((long)&pVVar41[-2].m_data + 8),(BufferVar *)local_3d0,
                         (SubTypeAccess *)CONCAT44(in_stack_fffffffffffffb44,MVar3),
                         in_stack_fffffffffffffb48);
              if ((_Rb_tree_node_base *)local_3c8._16_8_ != (_Rb_tree_node_base *)0x0) {
                operator_delete((void *)local_3c8._16_8_,
                                CONCAT44(DStack_3a8.basic.precision,DStack_3a8.basic.type) -
                                local_3c8._16_8_);
              }
              glu::VarType::~VarType((VarType *)local_3d0);
              pBVar37 = *(pointer *)
                         ((long)&(pBVar5->m_variables).
                                 super__Vector_base<vkt::ssbo::BufferVar,_std::allocator<vkt::ssbo::BufferVar>_>
                         + 8);
            }
            pVVar14 = pVVar41 + 1;
            pVVar41 = (VarType *)((long)&pVVar41[2].m_data + 8);
          } while ((pointer)&pVVar14->m_data != pBVar37);
        }
        if ((undefined1 *)local_498._0_8_ != local_498 + 0x10) {
          operator_delete((void *)local_498._0_8_,(ulong)(local_498._16_8_ + 1));
        }
        uVar16 = (int)block + 1;
        block = (BufferBlock *)(ulong)uVar16;
      } while (uVar16 != (uint)local_438);
      pSVar38 = (ShaderInterface *)
                ((long)&(local_440->m_structs).
                        super__Vector_base<glu::StructType_*,_std::allocator<glu::StructType_*>_>.
                        _M_impl.super__Vector_impl_data._M_start + 1);
      ppBVar28 = (this->m_interface).m_bufferBlocks.
                 super__Vector_base<vkt::ssbo::BufferBlock_*,_std::allocator<vkt::ssbo::BufferBlock_*>_>
                 ._M_impl.super__Vector_impl_data._M_start;
    } while ((long)pSVar38 <
             (long)(int)((ulong)((long)(this->m_interface).m_bufferBlocks.
                                       super__Vector_base<vkt::ssbo::BufferBlock_*,_std::allocator<vkt::ssbo::BufferBlock_*>_>
                                       ._M_impl.super__Vector_impl_data._M_finish - (long)ppBVar28)
                        >> 3));
  }
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"\tif (allOk)\n",0xc);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)local_1a8,"\t\tac_numPassed++;\n",0x12);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"\n",1);
  ppBVar28 = (this->m_interface).m_bufferBlocks.
             super__Vector_base<vkt::ssbo::BufferBlock_*,_std::allocator<vkt::ssbo::BufferBlock_*>_>
             ._M_impl.super__Vector_impl_data._M_start;
  if (0 < (int)((ulong)((long)(this->m_interface).m_bufferBlocks.
                              super__Vector_base<vkt::ssbo::BufferBlock_*,_std::allocator<vkt::ssbo::BufferBlock_*>_>
                              ._M_impl.super__Vector_impl_data._M_finish - (long)ppBVar28) >> 3)) {
    pvVar39 = (vector<vkt::ssbo::BlockDataPtr,_std::allocator<vkt::ssbo::BlockDataPtr>_> *)0x0;
    do {
      pBVar5 = ppBVar28[(long)pvVar39];
      iVar49 = pBVar5->m_arraySize;
      iVar46 = 1;
      if (1 < iVar49) {
        iVar46 = iVar49;
      }
      if (iVar49 < 1) {
        iVar46 = 1;
      }
      iVar47 = 0;
      local_428 = pvVar39;
      do {
        pcVar10 = (pBVar5->m_blockName)._M_dataplus._M_p;
        if (iVar49 < 1) {
          puVar21 = &local_458;
          plVar22 = &local_450;
          local_460 = &local_450;
        }
        else {
          std::__cxx11::ostringstream::ostringstream((ostringstream *)local_3d0);
          std::ostream::operator<<((BufferVar *)local_3d0,iVar47);
          std::__cxx11::stringbuf::str();
          std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_3d0);
          std::ios_base::~ios_base(local_360);
          plVar22 = (long *)std::__cxx11::string::replace((ulong)local_1c8,0,(char *)0x0,0xb2a0c0);
          local_420 = &local_410;
          plVar33 = plVar22 + 2;
          if ((long *)*plVar22 == plVar33) {
            local_410 = *plVar33;
            lStack_408 = plVar22[3];
          }
          else {
            local_410 = *plVar33;
            local_420 = (long *)*plVar22;
          }
          local_418 = plVar22[1];
          *plVar22 = (long)plVar33;
          plVar22[1] = 0;
          *(undefined1 *)(plVar22 + 2) = 0;
          puVar24 = (undefined8 *)std::__cxx11::string::append((char *)&local_420);
          plVar22 = puVar24 + 2;
          if ((long *)*puVar24 == plVar22) {
            local_450 = *plVar22;
            uStack_448 = puVar24[3];
            local_460 = &local_450;
          }
          else {
            local_450 = *plVar22;
            local_460 = (long *)*puVar24;
          }
          puVar21 = puVar24 + 1;
          local_458 = puVar24[1];
          *puVar24 = plVar22;
        }
        *puVar21 = 0;
        *(undefined1 *)plVar22 = 0;
        strlen(pcVar10);
        puVar21 = (undefined8 *)
                  std::__cxx11::string::replace((ulong)&local_460,0,(char *)0x0,(ulong)pcVar10);
        local_498._0_8_ = local_498 + 0x10;
        puVar34 = puVar21 + 2;
        if ((ulong *)*puVar21 == puVar34) {
          local_498._16_8_ = *puVar34;
          local_498._24_8_ = puVar21[3];
        }
        else {
          local_498._16_8_ = *puVar34;
          local_498._0_8_ = (ulong *)*puVar21;
        }
        local_498._8_8_ = puVar21[1];
        *puVar21 = puVar34;
        puVar21[1] = 0;
        *(undefined1 *)(puVar21 + 2) = 0;
        if (local_460 != &local_450) {
          operator_delete(local_460,local_450 + 1);
        }
        if (0 < iVar49) {
          if (local_420 != &local_410) {
            operator_delete(local_420,local_410 + 1);
          }
          if (local_1c8[0] != local_1b8) {
            operator_delete(local_1c8[0],local_1b8[0] + 1);
          }
        }
        iVar19 = BufferLayout::getBlockIndex(local_468,(string *)local_498);
        pBVar32 = (pBVar5->m_variables).
                  super__Vector_base<vkt::ssbo::BufferVar,_std::allocator<vkt::ssbo::BufferVar>_>.
                  _M_impl.super__Vector_impl_data._M_start;
        pBVar37 = (pBVar5->m_variables).
                  super__Vector_base<vkt::ssbo::BufferVar,_std::allocator<vkt::ssbo::BufferVar>_>.
                  _M_impl.super__Vector_impl_data._M_finish;
        if (pBVar32 != pBVar37) {
          pBVar11 = (((_Vector_base<vkt::ssbo::BlockDataPtr,_std::allocator<vkt::ssbo::BlockDataPtr>_>
                       *)&local_430->m_name)->_M_impl).super__Vector_impl_data._M_start;
          pVVar41 = &pBVar32->m_type;
          do {
            if ((pVVar41[1].m_type & 0x400) != TYPE_BASIC) {
              glu::SubTypeAccess::SubTypeAccess((SubTypeAccess *)local_3d0,pVVar41);
              anon_unknown_15::generateWriteSrc
                        ((ostream *)local_1a8,local_468,pBVar5,iVar47,pBVar11 + iVar19,
                         (BufferVar *)((long)&pVVar41[-2].m_data + 8),(SubTypeAccess *)local_3d0);
              if ((_Rb_tree_node_base *)local_3c8._16_8_ != (_Rb_tree_node_base *)0x0) {
                operator_delete((void *)local_3c8._16_8_,
                                CONCAT44(DStack_3a8.basic.precision,DStack_3a8.basic.type) -
                                local_3c8._16_8_);
              }
              glu::VarType::~VarType((VarType *)local_3d0);
              pBVar37 = (pBVar5->m_variables).
                        super__Vector_base<vkt::ssbo::BufferVar,_std::allocator<vkt::ssbo::BufferVar>_>
                        ._M_impl.super__Vector_impl_data._M_finish;
            }
            pVVar14 = pVVar41 + 1;
            pVVar41 = (VarType *)((long)&pVVar41[2].m_data + 8);
          } while ((pointer)&pVVar14->m_data != pBVar37);
        }
        if ((undefined1 *)local_498._0_8_ != local_498 + 0x10) {
          operator_delete((void *)local_498._0_8_,(ulong)(local_498._16_8_ + 1));
        }
        iVar47 = iVar47 + 1;
      } while (iVar47 != iVar46);
      pvVar39 = (vector<vkt::ssbo::BlockDataPtr,_std::allocator<vkt::ssbo::BlockDataPtr>_> *)
                ((long)&(local_428->
                        super__Vector_base<vkt::ssbo::BlockDataPtr,_std::allocator<vkt::ssbo::BlockDataPtr>_>
                        )._M_impl.super__Vector_impl_data._M_start + 1);
      ppBVar28 = (this->m_interface).m_bufferBlocks.
                 super__Vector_base<vkt::ssbo::BufferBlock_*,_std::allocator<vkt::ssbo::BufferBlock_*>_>
                 ._M_impl.super__Vector_impl_data._M_start;
    } while ((long)pvVar39 <
             (long)(int)((ulong)((long)(this->m_interface).m_bufferBlocks.
                                       super__Vector_base<vkt::ssbo::BufferBlock_*,_std::allocator<vkt::ssbo::BufferBlock_*>_>
                                       ._M_impl.super__Vector_impl_data._M_finish - (long)ppBVar28)
                        >> 3));
  }
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"}\n",2);
  std::__cxx11::stringbuf::str();
  if ((pointer)local_238._0_8_ != (pointer)0x0) {
    operator_delete((void *)local_238._0_8_,(long)local_228 - local_238._0_8_);
  }
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1a8);
  std::ios_base::~ios_base(local_138);
  std::__cxx11::string::operator=((string *)&this->m_computeShaderSrc,(string *)local_3d0);
  pcVar29 = local_3c8 + 8;
  if (local_3d0 != (undefined1  [8])pcVar29) {
    operator_delete((void *)local_3d0,local_3c8._8_8_ + 1);
    pcVar29 = extraout_RAX;
  }
  return (int)pcVar29;
}

Assistant:

void SSBOLayoutCase::init ()
{
	computeReferenceLayout	(m_refLayout, m_interface);
	initRefDataStorage		(m_interface, m_refLayout, m_initialData);
	initRefDataStorage		(m_interface, m_refLayout, m_writeData);
	generateValues			(m_refLayout, m_initialData.pointers, deStringHash(getName()) ^ 0xad2f7214);
	generateValues			(m_refLayout, m_writeData.pointers, deStringHash(getName()) ^ 0x25ca4e7);
	copyNonWrittenData		(m_interface, m_refLayout, m_initialData.pointers, m_writeData.pointers);

	m_computeShaderSrc = generateComputeShader(m_interface, m_refLayout, m_initialData.pointers, m_writeData.pointers, m_matrixLoadFlag);

}